

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.cpp
# Opt level: O2

void __thiscall CCoinsViewCache::SanityCheck(CCoinsViewCache *this)

{
  long lVar1;
  CoinsCachePair *pCVar2;
  uint uVar3;
  size_t sVar4;
  uint uVar5;
  CoinsCachePair *pCVar6;
  __node_base *p_Var7;
  long lVar8;
  size_t sVar9;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var7 = &(this->cacheCoins)._M_h._M_before_begin;
  lVar8 = 0;
  sVar9 = 0;
  while (p_Var7 = p_Var7->_M_nxt, p_Var7 != (__node_base *)0x0) {
    uVar5 = *(byte *)&p_Var7[8]._M_nxt & 3;
    uVar3 = uVar5 + 4;
    if (p_Var7[9]._M_nxt != (_Hash_node_base *)0xffffffffffffffff) {
      uVar3 = uVar5;
    }
    if ((uVar3 < 8) && ((0x94U >> uVar3 & 1) != 0)) {
      __assert_fail("attr != 2 && attr != 4 && attr != 7",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/coins.cpp"
                    ,0x149,"void CCoinsViewCache::SanityCheck() const");
    }
    sVar4 = Coin::DynamicMemoryUsage((Coin *)(p_Var7 + 9));
    sVar9 = sVar9 + sVar4;
    lVar8 = (lVar8 + 1) - (ulong)(((ulong)p_Var7[8]._M_nxt & 3) == 0);
  }
  pCVar6 = (this->m_sentinel).second.m_next;
  while( true ) {
    if (pCVar6 == &this->m_sentinel) {
      if (lVar8 != 0) {
        __assert_fail("count_linked == count_flagged",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/coins.cpp"
                      ,0x15c,"void CCoinsViewCache::SanityCheck() const");
      }
      if (sVar9 == this->cachedCoinsUsage) {
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          return;
        }
        __stack_chk_fail();
      }
      __assert_fail("recomputed_usage == cachedCoinsUsage",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/coins.cpp"
                    ,0x15d,"void CCoinsViewCache::SanityCheck() const");
    }
    pCVar2 = (pCVar6->second).m_next;
    if ((pCVar2->second).m_prev != pCVar6) {
      __assert_fail("it->second.Next()->second.Prev() == it",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/coins.cpp"
                    ,0x155,"void CCoinsViewCache::SanityCheck() const");
    }
    if ((((pCVar6->second).m_prev)->second).m_next != pCVar6) break;
    if (((pCVar6->second).m_flags & 3) == 0) {
      __assert_fail("it->second.IsDirty() || it->second.IsFresh()",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/coins.cpp"
                    ,0x158,"void CCoinsViewCache::SanityCheck() const");
    }
    lVar8 = lVar8 + -1;
    pCVar6 = pCVar2;
  }
  __assert_fail("it->second.Prev()->second.Next() == it",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/coins.cpp"
                ,0x156,"void CCoinsViewCache::SanityCheck() const");
}

Assistant:

void CCoinsViewCache::SanityCheck() const
{
    size_t recomputed_usage = 0;
    size_t count_flagged = 0;
    for (const auto& [_, entry] : cacheCoins) {
        unsigned attr = 0;
        if (entry.IsDirty()) attr |= 1;
        if (entry.IsFresh()) attr |= 2;
        if (entry.coin.IsSpent()) attr |= 4;
        // Only 5 combinations are possible.
        assert(attr != 2 && attr != 4 && attr != 7);

        // Recompute cachedCoinsUsage.
        recomputed_usage += entry.coin.DynamicMemoryUsage();

        // Count the number of entries we expect in the linked list.
        if (entry.IsDirty() || entry.IsFresh()) ++count_flagged;
    }
    // Iterate over the linked list of flagged entries.
    size_t count_linked = 0;
    for (auto it = m_sentinel.second.Next(); it != &m_sentinel; it = it->second.Next()) {
        // Verify linked list integrity.
        assert(it->second.Next()->second.Prev() == it);
        assert(it->second.Prev()->second.Next() == it);
        // Verify they are actually flagged.
        assert(it->second.IsDirty() || it->second.IsFresh());
        // Count the number of entries actually in the list.
        ++count_linked;
    }
    assert(count_linked == count_flagged);
    assert(recomputed_usage == cachedCoinsUsage);
}